

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

LogLevel pbrt::LogLevelFromString(string *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    local_4 = Verbose;
  }
  else {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if (bVar1) {
      local_4 = Error;
    }
    else {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
      if (bVar1) {
        local_4 = Fatal;
      }
      else {
        local_4 = Invalid;
      }
    }
  }
  return local_4;
}

Assistant:

LogLevel LogLevelFromString(const std::string &s) {
    if (s == "verbose")
        return LogLevel::Verbose;
    else if (s == "error")
        return LogLevel::Error;
    else if (s == "fatal")
        return LogLevel::Fatal;
    return LogLevel::Invalid;
}